

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::JavascriptFunction::GetSetter
          (JavascriptFunction *this,JavascriptString *propertyNameString,Var *setterValue,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyId propertyId;
  DescriptorFlags DVar2;
  ScriptContext *this_00;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  ScriptContext *pSStack_38;
  DescriptorFlags flags;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  JavascriptString *propertyNameString_local;
  JavascriptFunction *this_local;
  
  pSStack_38 = requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)setterValue;
  setterValue_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::FindPropertyRecord(this_00,(JavascriptString *)setterValue_local,&local_48);
  if (local_48 != (PropertyRecord *)0x0) {
    propertyId = PropertyRecord::GetPropertyId(local_48);
    bVar1 = GetSetterBuiltIns(this,propertyId,&info_local->m_instance,
                              (PropertyValueInfo *)requestContext_local,pSStack_38,
                              (DescriptorFlags *)((long)&propertyRecord + 4));
    if (bVar1) {
      return propertyRecord._4_4_;
    }
  }
  DVar2 = DynamicObject::GetSetter
                    (&this->super_DynamicObject,(JavascriptString *)setterValue_local,
                     &info_local->m_instance,(PropertyValueInfo *)requestContext_local,pSStack_38);
  return DVar2;
}

Assistant:

DescriptorFlags JavascriptFunction::GetSetter(JavascriptString* propertyNameString, Var *setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags;
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && GetSetterBuiltIns(propertyRecord->GetPropertyId(), setterValue, info, requestContext, &flags))
        {
            return flags;
        }

        return __super::GetSetter(propertyNameString, setterValue, info, requestContext);
    }